

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

logical pnga_sprs_array_get_block
                  (Integer s_a,Integer irow,Integer icol,void **idx,void **jdx,void **data,
                  Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi)

{
  long lVar1;
  void *pvVar2;
  Integer IVar3;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long *in_stack_00000008;
  long *in_stack_00000010;
  undefined8 *in_stack_00000018;
  logical ret;
  Integer dummy;
  Integer offset;
  int index;
  int i;
  int longidx;
  int64_t len;
  Integer ld [2];
  Integer hi [3];
  Integer lo [3];
  int64_t params [7];
  Integer hdl;
  Integer *in_stack_000001f8;
  Integer *in_stack_00000200;
  Integer in_stack_00000208;
  Integer in_stack_00000210;
  logical local_f8;
  long local_78;
  long local_70;
  undefined8 local_68;
  undefined8 local_60;
  long local_58;
  long local_50;
  int local_48;
  
  local_f8 = 1;
  pnga_get(params[4],(Integer *)params[3],(Integer *)params[2],(void *)params[1],
           (Integer *)params[0]);
  *in_stack_00000008 = local_78;
  *in_stack_00000010 = local_70;
  *in_stack_00000018 = local_68;
  *(undefined8 *)ret = local_60;
  lVar1 = (local_50 - local_58) + 1;
  if (lVar1 < 1) {
    local_f8 = 0;
  }
  else {
    pvVar2 = malloc(((*in_stack_00000010 - *in_stack_00000008) + 2) * 8);
    *in_RCX = pvVar2;
    pvVar2 = malloc(lVar1 * 8);
    *in_R8 = pvVar2;
    pvVar2 = malloc(lVar1 * SPA[in_RDI + 1000].size);
    *in_R9 = pvVar2;
    pnga_get(params[4],(Integer *)params[3],(Integer *)params[2],(void *)params[1],
             (Integer *)params[0]);
    pnga_get(params[4],(Integer *)params[3],(Integer *)params[2],(void *)params[1],
             (Integer *)params[0]);
    if (local_48 == -1) {
      IVar3 = pnga_nodeid();
      printf("p[%d] irow: %d icol: %d iblk: %d ilo: %d ihi: %d jlo: %d jhi: %d len: %d\n",IVar3,
             in_RSI,in_RDX,0xffffffff,*in_stack_00000008,*in_stack_00000010,*in_stack_00000018,
             *(undefined8 *)ret,lVar1);
      pnga_error((char *)lo[2],lo[1]);
    }
    pnga_distribution(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
    pnga_get(params[4],(Integer *)params[3],(Integer *)params[2],(void *)params[1],
             (Integer *)params[0]);
  }
  return local_f8;
}

Assistant:

logical pnga_sprs_array_get_block(Integer s_a, Integer irow, Integer icol,
   void **idx, void **jdx, void **data, Integer *ilo, Integer *ihi,
    Integer *jlo, Integer *jhi)
{
  Integer hdl = GA_OFFSET + s_a;
  int64_t params[7];
  Integer lo[3], hi[3];
  Integer ld[2];
  int64_t len;
  int longidx;
  int i, index;
  Integer offset, dummy;
  logical ret = 1;

  /* retrieve location of block in distributed arrays */
  lo[0] = 1;
  lo[1] = irow+1;
  lo[2] = icol+1;
  hi[0] = 7;
  hi[1] = irow+1;
  hi[2] = icol+1;
  ld[0] = 7;
  ld[1] = 1;
  pnga_get(SPA[hdl].g_blk,lo,hi,params,ld);

  *ilo = params[0];
  *ihi = params[1];
  *jlo = params[2];
  *jhi = params[3];
  /* allocate arrays to hold block */
  len = params[5]-params[4]+1;
  index = params[6];
  /*
  printf("p[%ld] Getting block [%d,%d] ilo: %ld ihi: %ld jlo: %ld jhi: %ld len: %ld clo: %ld chi: %ld\n",
      pnga_nodeid(),irow,icol,*ilo,*ihi,*jlo,*jhi,len,params[4],params[5]);
      */
  if (len > 0) {
    *idx = (Integer*)malloc((*ihi-*ilo+2)*sizeof(Integer));
    *jdx = (Integer*)malloc(len*sizeof(Integer));
    *data = malloc(len*SPA[hdl].size);
    lo[0] = params[4];
    hi[0] = params[5];
    ld[0] = 1;
    pnga_get(SPA[hdl].g_j,lo,hi,*jdx,ld);
    pnga_get(SPA[hdl].g_data,lo,hi,*data,ld);

    if (index == -1) {
      printf("p[%d] irow: %d icol: %d iblk: %d ilo: %d ihi: %d jlo: %d jhi: %d len: %d\n",
          pnga_nodeid(),irow,icol,index,*ilo,*ihi,*jlo,*jhi,len);
      pnga_error("sprs_array_get_block no block found",index);
    }
    pnga_distribution(SPA[hdl].g_i,irow,&offset,&dummy);
    lo[0] = offset+index*(*ihi-*ilo+2);
    hi[0] = offset+(index+1)*(*ihi-*ilo+2)-1;
    pnga_get(SPA[hdl].g_i,lo,hi,*idx,ld);
    /*
    printf("p[%ld] row offsets in get_block for block: %ld icol %ld\n",
        pnga_nodeid(),index,SPA[hdl].blkidx[index]);
    for (i=lo[0]; i<hi[0]; i++) {
      int64_t *ptr = (int64_t*)*idx;
      printf("p[%ld]     row: %ld idx: %ld idx+1: %ld",pnga_nodeid(),
          i,ptr[i-lo[0]],ptr[i+1-lo[0]]);
      if (ptr[i+1-lo[0]]-ptr[i-lo[0]] > 0) {
        printf(" first j: %ld val: %d\n",
            ((int64_t*)(*jdx))[ptr[i-lo[0]]],
            ((int*)(*data))[ptr[i-lo[0]]]);
      } else {
        printf("\n");
      }
    }
    */
  } else {
    /* block has no data */
    *idx == NULL;
    *jdx == NULL;
    *data == NULL;
    ret = 0;
  }
  return ret;
}